

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseConst(WastParser *this,Const *const_,ConstType const_type)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  Result RVar2;
  Enum EVar3;
  Token token_1;
  uint32_t u32;
  Token token;
  Token opcode_token;
  Token local_128;
  size_t local_e8;
  char *pcStack_e0;
  size_t local_d8;
  undefined8 uStack_d0;
  uint64_t local_c8 [3];
  Token local_b0;
  Token local_70;
  
  Consume(&local_70,this);
  if (0x46 < local_70.token_type_ - AtomicFence) {
    __assert_fail("HasOpcode()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                  ,0x6d,"Opcode wabt::Token::opcode() const");
  }
  GetToken(&local_b0,this);
  local_128.loc.field_1.field_1.offset = local_b0.loc.field_1.field_1.offset;
  local_128.loc.field_1._8_8_ = local_b0.loc.field_1._8_8_;
  local_128.loc.filename._M_len = local_b0.loc.filename._M_len;
  local_128.loc.filename._M_str = local_b0.loc.filename._M_str;
  (const_->loc).field_1.field_1.offset = (size_t)local_b0.loc.field_1.field_1.offset;
  *(undefined8 *)((long)&(const_->loc).field_1 + 8) = local_b0.loc.field_1._8_8_;
  (const_->loc).filename._M_len = local_b0.loc.filename._M_len;
  (const_->loc).filename._M_str = local_b0.loc.filename._M_str;
  GetToken(&local_b0,this);
  if (local_70.field_2.type_.enum_ == 0xea) {
LAB_0019c2fa:
    ErrorUnlessOpcodeEnabled(this,&local_70);
    RVar2 = ParseSimdV128Const(this,const_,local_b0.token_type_,const_type);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    goto LAB_0019c4fe;
  }
  if ((0x3b < (ulong)local_b0.token_type_) ||
     ((0xe00000c00000000U >> ((ulong)local_b0.token_type_ & 0x3f) & 1) == 0)) {
    paVar1 = &local_128.loc.field_1;
    local_128.loc.filename._M_len = (size_t)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"a numeric literal","");
    local_c8[0] = 0;
    local_c8[1] = 0;
    local_c8[2] = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_c8,
               &local_128,&local_128.token_type_);
    RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_c8,"123, -45, 6.7e8");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c8);
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_128.loc.filename._M_len == paVar1) {
      return (Result)RVar2.enum_;
    }
    operator_delete((void *)local_128.loc.filename._M_len,
                    (long)local_128.loc.field_1.field_1.offset + 1);
    return (Result)RVar2.enum_;
  }
  switch(local_70.field_2.type_.enum_) {
  case ~(Void|I16U):
    Consume(&local_128,this);
    RVar2.enum_ = Error;
    if (2 < local_128.token_type_ - First_Literal) goto LAB_0019c4fe;
    RVar2 = ParseInt32(local_128.field_2.literal_.text._M_str,
                       local_128.field_2.text_._M_str + (long)local_128.field_2.literal_.text._M_str
                       ,(uint32_t *)local_c8,SignedAndUnsigned);
    (const_->type_).enum_ = I32;
    (const_->type_).type_index_ = 0;
    *(undefined4 *)(const_->data_).v = (undefined4)local_c8[0];
    break;
  case 0x3a:
    Consume(&local_128,this);
    RVar2.enum_ = Error;
    if (2 < local_128.token_type_ - First_Literal) goto LAB_0019c4fe;
    RVar2 = ParseInt64(local_128.field_2.literal_.text._M_str,
                       local_128.field_2.text_._M_str + (long)local_128.field_2.literal_.text._M_str
                       ,local_c8,SignedAndUnsigned);
    (const_->type_).enum_ = I64;
    (const_->type_).type_index_ = 0;
    *(uint64_t *)(const_->data_).v = local_c8[0];
    break;
  case ~(Void|I8U):
    RVar2 = ParseF32(this,const_,const_type);
    goto LAB_0019c4fe;
  case 0x3c:
    RVar2 = ParseF64(this,const_,const_type);
    goto LAB_0019c4fe;
  default:
    if (local_70.field_2.type_.enum_ != 0xea) {
      __assert_fail("!\"ParseConst called with invalid opcode\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                    ,0xb85,"Result wabt::WastParser::ParseConst(Const *, ConstType)");
    }
    goto LAB_0019c2fa;
  }
  const_->nan_[0] = None;
LAB_0019c4fe:
  EVar3 = Ok;
  if (RVar2.enum_ == Error) {
    local_e8 = (const_->loc).filename._M_len;
    pcStack_e0 = (const_->loc).filename._M_str;
    local_d8 = (const_->loc).field_1.field_1.offset;
    uStack_d0 = *(undefined8 *)((long)&(const_->loc).field_1 + 8);
    Token::to_string_abi_cxx11_((string *)&local_128,&local_b0);
    Error(this,0x1ff0ce,(char *)local_128.loc.filename._M_len);
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_128.loc.filename._M_len !=
        &local_128.loc.field_1) {
      operator_delete((void *)local_128.loc.filename._M_len,
                      (long)local_128.loc.field_1.field_1.offset + 1);
    }
    EVar3 = Error;
  }
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseConst(Const* const_, ConstType const_type) {
  WABT_TRACE(ParseConst);
  Token opcode_token = Consume();
  Opcode opcode = opcode_token.opcode();
  const_->loc = GetLocation();
  Token token = GetToken();

  // V128 is fully handled by ParseSimdV128Const:
  if (opcode != Opcode::V128Const) {
    switch (token.token_type()) {
      case TokenType::Nat:
      case TokenType::Int:
      case TokenType::Float:
        // OK.
        break;
      case TokenType::NanArithmetic:
      case TokenType::NanCanonical:
        break;
      default:
        return ErrorExpected({"a numeric literal"}, "123, -45, 6.7e8");
    }
  }

  Result result;
  switch (opcode) {
    case Opcode::I32Const: {
      auto token = Consume();
      if (!token.HasLiteral()) {
        result = Result::Error;
        break;
      }
      auto sv = token.literal().text;
      uint32_t u32;
      result = ParseInt32(sv, &u32, ParseIntType::SignedAndUnsigned);
      const_->set_u32(u32);
      break;
    }

    case Opcode::I64Const: {
      auto token = Consume();
      if (!token.HasLiteral()) {
        result = Result::Error;
        break;
      }
      auto sv = token.literal().text;
      uint64_t u64;
      result = ParseInt64(sv, &u64, ParseIntType::SignedAndUnsigned);
      const_->set_u64(u64);
      break;
    }

    case Opcode::F32Const:
      result = ParseF32(const_, const_type);
      break;

    case Opcode::F64Const:
      result = ParseF64(const_, const_type);
      break;

    case Opcode::V128Const:
      ErrorUnlessOpcodeEnabled(opcode_token);
      // Parse V128 Simd Const (16 bytes).
      result = ParseSimdV128Const(const_, token.token_type(), const_type);
      // ParseSimdV128Const report error already, just return here if parser get
      // errors.
      if (Failed(result)) {
        return Result::Error;
      }
      break;

    default:
      assert(!"ParseConst called with invalid opcode");
      return Result::Error;
  }

  if (Failed(result)) {
    Error(const_->loc, "invalid literal \"%s\"", token.to_string().c_str());
    // Return if parser get errors.
    return Result::Error;
  }

  return Result::Ok;
}